

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlocalserver.cpp
# Opt level: O3

void QLocalServer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  long lVar2;
  long *plVar3;
  long in_FS_OFFSET;
  QFlagsStorage<QLocalServer::SocketOption> local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QLocalServerPrivate::_q_onNewConnection(*(QLocalServerPrivate **)(_o + 8));
        return;
      }
      goto LAB_0023f159;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
        return;
      }
      goto LAB_0023f159;
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      puVar1 = (undefined4 *)*_a;
      lVar2 = *(long *)(_o + 8);
      if ((*(long **)(lVar2 + 0x48) != (long *)0x0) && (**(long **)(lVar2 + 0x48) != 0)) {
        QBindingStorage::registerDependency_helper((QUntypedPropertyData *)(lVar2 + 0x40));
      }
      *puVar1 = *(undefined4 *)(lVar2 + 0xf8);
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      local_1c.i = **_a;
      QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
      ::setValue((QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
                  *)(*(long *)(_o + 8) + 0xf8),(parameter_type)&local_1c);
    }
    break;
  default:
    if (_c == BindableProperty && _id == 0) {
      plVar3 = (long *)*_a;
      *plVar3 = *(long *)(_o + 8) + 0xf8;
      plVar3[1] = (long)&QtPrivate::
                         QBindableInterfaceForProperty<QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>,_void>
                         ::iface;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == newConnection) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0023f159:
  __stack_chk_fail();
}

Assistant:

void QLocalServer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLocalServer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->newConnection(); break;
        case 1: _t->d_func()->_q_onNewConnection(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLocalServer::*)()>(_a, &QLocalServer::newConnection, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: QtMocHelpers::assignFlags<SocketOptions>(_v, _t->socketOptions()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSocketOptions(*reinterpret_cast<SocketOptions*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSocketOptions(); break;
        default: break;
        }
    }
}